

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O1

UChar * icu_63::PatternProps::skipWhiteSpace(UChar *s,int32_t length)

{
  UChar UVar1;
  bool bVar2;
  int iVar3;
  
  if (0 < length) {
    iVar3 = length + 1;
    do {
      UVar1 = *s;
      if ((ushort)UVar1 < 0x100) {
        bVar2 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
      }
      else if ((ushort)UVar1 - 0x200e < 0x1c) {
        bVar2 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
      }
      else {
        bVar2 = false;
      }
      if (bVar2 == false) {
        return s;
      }
      s = s + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return s;
}

Assistant:

const UChar *
PatternProps::skipWhiteSpace(const UChar *s, int32_t length) {
    while(length>0 && isWhiteSpace(*s)) {
        ++s;
        --length;
    }
    return s;
}